

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_cache_ptr.cc
# Opt level: O2

ThreadCachePtr tcmalloc::ThreadCachePtr::GetReallySlow(void)

{
  ThreadCache *pTVar1;
  Entry *entry;
  undefined8 extraout_RDX;
  undefined8 uVar2;
  ThreadCachePtr TVar3;
  undefined1 local_28 [8];
  Result tr;
  
  ThreadCache::InitModule();
  SlowTLS::Lookup();
  if (tr.ht_place_ == (Entry **)0x0) {
    pTVar1 = ThreadCache::NewHeap();
    entry = (Entry *)MetaDataAlloc(0x28);
    entry->cache = pTVar1;
    entry->emergency_malloc = false;
    entry->was_allocated = true;
    SlowTLS::RegisterEntry((Result *)local_28,entry);
    uVar2 = 0;
  }
  else {
    pTVar1 = (ThreadCache *)*tr.ht_place_;
    uVar2 = CONCAT71((int7)((ulong)extraout_RDX >> 8),*(undefined1 *)(tr.ht_place_ + 1));
  }
  TVar3._8_8_ = uVar2;
  TVar3.ptr_ = pTVar1;
  return TVar3;
}

Assistant:

ATTRIBUTE_NOINLINE
ThreadCachePtr ThreadCachePtr::GetReallySlow() {
  // This is called after we found no cache in regular TLS storage and
  // that TLS storage key isn't set up yet. I.e. process is running,
  // but not all C++ initializers (in this specific case,
  // InitThreadCachePtrLate) ran yet.
  //
  // Not just only that, but we might be dealing with entirely
  // uninitialized malloc. So we handle that first.
  ThreadCache::InitModule();

  // InitModule does some locking (and super-unlikely, but not
  // impossibly, some sleeping). Also it runs some malloc as well
  // (e.g. for pthread_atfork). So here we might actually find
  // thread's cache to be present.

  SlowTLS::Result tr = SlowTLS::Lookup();

  if (tr.Found()) {
    return {tr.GetCache(), tr.IsEmergencyMalloc()};
  }

  ThreadCache* cache = ThreadCache::NewHeap();

  // Note, we allocate slow tls registration and "leak" it. We expect
  // just single thread (initial thread) in most common cases. And
  // maybe, very rarely several. So leaking a little memory is totally
  // harmless. After all, it is our general approach to never free
  // metadata allocations. Plus, those threads that are either initial
  // thread or are allocated before program's main() tend to live
  // forever anyways.
  void* memory = MetaDataAlloc(sizeof(SlowTLS::Entry));
  SlowTLS::Entry* allocated_registration = new (memory) SlowTLS::Entry{cache};
  allocated_registration->was_allocated = true;

  SlowTLS::RegisterEntry(&tr, allocated_registration);

  return {cache, false};
}